

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_visual.cxx
# Opt level: O0

int Fl::visual(int flags)

{
  int iVar1;
  long lVar2;
  int local_6c;
  XVisualInfo *pXStack_68;
  int i;
  XVisualInfo *found;
  XVisualInfo *visualList;
  undefined1 local_50 [4];
  int num;
  XVisualInfo vTemplate;
  int flags_local;
  
  vTemplate.colormap_size = flags;
  fl_open_display();
  iVar1 = test_visual(fl_visual,vTemplate.colormap_size);
  if (iVar1 == 0) {
    lVar2 = XGetVisualInfo(fl_display,0,local_50,(long)&visualList + 4);
    pXStack_68 = (XVisualInfo *)0x0;
    for (local_6c = 0; local_6c < visualList._4_4_; local_6c = local_6c + 1) {
      iVar1 = test_visual((XVisualInfo *)(lVar2 + (long)local_6c * 0x40),vTemplate.colormap_size);
      if ((iVar1 != 0) &&
         ((pXStack_68 == (XVisualInfo *)0x0 ||
          (pXStack_68->depth < *(int *)(lVar2 + (long)local_6c * 0x40 + 0x14))))) {
        pXStack_68 = (XVisualInfo *)(lVar2 + (long)local_6c * 0x40);
      }
    }
    if (pXStack_68 == (XVisualInfo *)0x0) {
      XFree(lVar2);
      vTemplate.bits_per_rgb = 0;
    }
    else {
      fl_visual = pXStack_68;
      fl_colormap = XCreateColormap(fl_display,
                                    *(undefined8 *)
                                     (*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10),
                                    pXStack_68->visual,0);
      vTemplate.bits_per_rgb = 1;
    }
  }
  else {
    vTemplate.bits_per_rgb = 1;
  }
  return vTemplate.bits_per_rgb;
}

Assistant:

int Fl::visual(int flags) {
#if USE_XDBE == 0
  if (flags & FL_DOUBLE) return 0;
#endif
  fl_open_display();
  // always use default if possible:
  if (test_visual(*fl_visual, flags)) return 1;
  // get all the visuals:
  XVisualInfo vTemplate;
  int num;
  XVisualInfo *visualList = XGetVisualInfo(fl_display, 0, &vTemplate, &num);
  // find all matches, use the one with greatest depth:
  XVisualInfo *found = 0;
  for (int i=0; i<num; i++) if (test_visual(visualList[i], flags)) {
    if (!found || found->depth < visualList[i].depth)
      found = &visualList[i];
  }
  if (!found) {XFree((void*)visualList); return 0;}
  fl_visual = found;
  fl_colormap = XCreateColormap(fl_display, RootWindow(fl_display,fl_screen),
				fl_visual->visual, AllocNone);
  return 1;
}